

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

ostream * MinVR::operator<<(ostream *os,VRVector3 *v)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"<");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xc));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1,">");
  return poVar1;
}

Assistant:

std::ostream & operator<< ( std::ostream &os, const VRVector3 &v) {
  return os << "<" << v.x << ", " << v.y << ", " << v.z << ">";
}